

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void __thiscall WorkQueue<HTTPClosure>::Run(WorkQueue<HTTPClosure> *this)

{
  long lVar1;
  bool bVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> i;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
  *in_stack_ffffffffffffffa8;
  unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  char *pszName;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffe0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  while( true ) {
    uVar3 = (undefined1)((uint)in_stack_ffffffffffffffc8 >> 0x18);
    std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>::
    unique_ptr<std::default_delete<HTTPClosure>,void>
              ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
               in_stack_ffffffffffffffa8);
    MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffffa8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,pszName,in_stack_ffffffffffffffd0
               ,in_stack_ffffffffffffffcc,(bool)uVar3);
    while( true ) {
      uVar3 = false;
      if ((in_RDI[0xa8] & 1U) != 0) {
        uVar3 = std::
                deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                ::empty(in_stack_ffffffffffffffa8);
      }
      if ((bool)uVar3 == false) break;
      std::condition_variable::wait((unique_lock *)(in_RDI + 0x28));
    }
    if (((in_RDI[0xa8] & 1U) == 0) &&
       (bVar2 = std::
                deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                ::empty(in_stack_ffffffffffffffa8), bVar2)) {
      iVar4 = 3;
    }
    else {
      std::
      deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
      ::front((deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
               *)CONCAT17(uVar3,in_stack_ffffffffffffffb8));
      std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>::operator=
                ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
      std::
      deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
      ::pop_front(in_stack_ffffffffffffffa8);
      iVar4 = 0;
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffa8);
    if (iVar4 == 0) {
      in_stack_ffffffffffffffb0 =
           (unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
           std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>::operator*
                     ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
                      CONCAT17(uVar3,in_stack_ffffffffffffffb8));
      (*(code *)((in_stack_ffffffffffffffb0->_M_t).
                 super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
                 super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl)->_vptr_HTTPClosure)();
      iVar4 = 0;
    }
    std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>::~unique_ptr
              ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffffb8));
    if (iVar4 != 0) break;
    in_stack_ffffffffffffffc8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Run() EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        while (true) {
            std::unique_ptr<WorkItem> i;
            {
                WAIT_LOCK(cs, lock);
                while (running && queue.empty())
                    cond.wait(lock);
                if (!running && queue.empty())
                    break;
                i = std::move(queue.front());
                queue.pop_front();
            }
            (*i)();
        }
    }